

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O3

void __thiscall PInt::SetOps(PInt *this)

{
  char cVar1;
  int iVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  
  *(undefined2 *)&this->field_0x6a = 0x38;
  iVar2 = *(int *)&this->field_0x24;
  if (iVar2 == 1) {
    this->field_0x69 = 0x25;
    cVar1 = this->Unsigned;
    uVar4 = 0x12;
    uVar3 = 0xc;
  }
  else {
    if (iVar2 != 2) {
      if (iVar2 != 4) {
        __assert_fail("0 && \"Unhandled integer size\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobjtype.cpp"
                      ,800,"void PInt::SetOps()");
      }
      this->field_0x69 = 0x29;
      uVar3 = 0x10;
      goto LAB_0037bbb7;
    }
    this->field_0x69 = 0x27;
    cVar1 = this->Unsigned;
    uVar4 = 0x14;
    uVar3 = 0xe;
  }
  if (cVar1 != '\0') {
    uVar3 = uVar4;
  }
LAB_0037bbb7:
  this->field_0x68 = uVar3;
  return;
}

Assistant:

void PInt::SetOps()
{
	moveOp = OP_MOVE;
	RegType = REGT_INT;
	if (Size == 4)
	{
		storeOp = OP_SW;
		loadOp = OP_LW;
	}
	else if (Size == 1)
	{
		storeOp = OP_SB;
		loadOp = Unsigned ? OP_LBU : OP_LB;
	}
	else if (Size == 2)
	{
		storeOp = OP_SH;
		loadOp = Unsigned ? OP_LHU : OP_LH;
	}
	else
	{
		assert(0 && "Unhandled integer size");
		storeOp = OP_NOP;
	}
}